

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

void pnga_copy_patch(char *trans,Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,
                    Integer *bhi)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  Integer IVar4;
  Integer IVar5;
  logical lVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  void *pvVar10;
  void *subscript;
  long lVar11;
  long *plVar12;
  long lVar13;
  Integer *pIVar14;
  Integer *pIVar15;
  byte *pbVar16;
  byte *pbVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  void *ptr;
  Integer andim;
  Integer bndim;
  Integer atype;
  Integer los [7];
  Integer his [7];
  Integer lod [7];
  Integer ld [7];
  Integer hid [7];
  Integer btype;
  Integer bld [7];
  Integer ald [7];
  Integer factor_data [7];
  Integer factor_idx2 [7];
  Integer bdims [7];
  Integer adims [7];
  Integer bvalue [7];
  Integer *in_stack_fffffffffffff990;
  byte *local_668;
  Integer *local_660;
  byte *local_658;
  void *local_650;
  Integer local_648;
  Integer local_640;
  Integer local_638;
  long local_630;
  byte *local_628;
  undefined8 local_620;
  Integer local_618 [7];
  void *local_5e0;
  Integer local_5d8;
  Integer local_5d0;
  Integer *local_5c8;
  undefined8 uStack_5c0;
  Integer local_5b8 [8];
  Integer local_578 [8];
  Integer local_538 [8];
  Integer local_4f8;
  long local_4f0 [6];
  long local_4c0;
  Integer local_4b8 [8];
  Integer local_478 [8];
  long local_438 [6];
  long alStack_408 [10];
  Integer local_3b8 [8];
  Integer local_378 [8];
  _iterator_hdl local_338;
  
  iVar3 = _ga_sync_begin;
  uStack_5c0._4_4_ = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_660 = blo;
  local_648 = g_a;
  local_628 = (byte *)trans;
  IVar4 = pnga_get_pgroup(g_a);
  local_640 = g_b;
  IVar5 = pnga_get_pgroup(g_b);
  local_650 = (void *)pnga_pgroup_nodeid(IVar4);
  local_5e0 = (void *)pnga_pgroup_nodeid(IVar5);
  local_5d0 = IVar4;
  local_630 = pnga_get_pgroup_size(IVar4);
  local_5d8 = IVar5;
  local_638 = pnga_get_pgroup_size(IVar5);
  if (iVar3 != 0) {
    IVar4 = local_5d0;
    if (((local_638 < local_630) &&
        (IVar5 = pnga_pgroup_get_world(), IVar4 = local_5d8, local_5d0 == IVar5)) &&
       (IVar5 = pnga_pgroup_get_world(), IVar4 = local_5d8, local_5d8 == IVar5)) {
      pnga_sync();
    }
    else {
      pnga_pgroup_sync(IVar4);
    }
  }
  IVar4 = local_648;
  pnga_inquire(local_648,&local_620,(Integer *)&local_668,local_378);
  IVar5 = local_640;
  pnga_inquire(local_640,&local_4c0,(Integer *)&local_658,local_3b8);
  pbVar17 = local_668;
  if (IVar4 == IVar5) {
    lVar6 = pnga_comp_patch((Integer)local_668,alo,ahi,(Integer)local_658,local_660,bhi);
    if (lVar6 != 0) {
      return;
    }
    lVar6 = pnga_patch_intersect(alo,ahi,local_660,bhi,(Integer)pbVar17);
    if (lVar6 != 0) {
      pnga_error("array patches cannot overlap ",0);
    }
  }
  if (CONCAT44(local_620._4_4_,(int)local_620) != local_4c0) {
    pnga_error("array type mismatch ",0);
  }
  if (0 < (long)local_668) {
    lVar21 = 0;
    do {
      if ((alo[lVar21] < 1) || (local_378[lVar21] < ahi[lVar21])) {
        pnga_error("g_a indices out of range ",0);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (long)local_668);
  }
  if (0 < (long)local_658) {
    lVar21 = 0;
    do {
      if ((local_660[lVar21] < 1) || (local_3b8[lVar21] < bhi[lVar21])) {
        pnga_error("g_b indices out of range ",0);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (long)local_658);
  }
  lVar21 = 1;
  lVar11 = 1;
  if (0 < (long)local_668) {
    pbVar17 = (byte *)0x0;
    do {
      lVar11 = lVar11 * ((ahi[(long)pbVar17] - alo[(long)pbVar17]) + 1);
      pbVar17 = pbVar17 + 1;
    } while (local_668 != pbVar17);
  }
  if (0 < (long)local_658) {
    lVar21 = 1;
    pbVar17 = (byte *)0x0;
    do {
      lVar21 = lVar21 * ((bhi[(long)pbVar17] - local_660[(long)pbVar17]) + 1);
      pbVar17 = pbVar17 + 1;
    } while (local_658 != pbVar17);
  }
  if (lVar11 != lVar21) {
    pnga_error("capacities two of patches do not match ",0);
  }
  uVar7 = pnga_total_blocks(local_648);
  uVar8 = pnga_total_blocks(local_640);
  if (-1 < (long)(uVar7 & uVar8)) {
    if ((*local_628 | 0x20) != 0x6e) {
      pnga_error("Transpose option not supported for block-cyclic data",0);
    }
    if (local_668 == local_658) {
      if (0 < (long)local_668) {
        pbVar17 = (byte *)0x0;
        do {
          if (ahi[(long)pbVar17] - alo[(long)pbVar17] !=
              bhi[(long)pbVar17] - local_660[(long)pbVar17]) goto LAB_001143a4;
          pbVar17 = pbVar17 + 1;
        } while (local_668 != pbVar17);
      }
    }
    else {
LAB_001143a4:
      pnga_error("Change in shape not supported for block-cyclic data",0);
    }
  }
  if ((long)(uVar7 & uVar8) < 0) {
    pvVar10 = local_650;
    IVar4 = local_648;
    if (local_638 < local_630) {
      pvVar10 = local_5e0;
      IVar4 = local_640;
    }
    pnga_distribution(IVar4,(Integer)pvVar10,local_618,local_5b8);
    pIVar14 = ahi;
    pIVar15 = alo;
    pbVar17 = local_668;
    if (local_638 < local_630) {
      pIVar14 = bhi;
      pIVar15 = local_660;
      pbVar17 = local_658;
    }
    lVar6 = pnga_patch_intersect(pIVar15,pIVar14,local_618,local_5b8,(Integer)pbVar17);
    if (lVar6 == 0) goto LAB_001154e8;
    IVar4 = local_648;
    if (local_638 < local_630) {
      IVar4 = local_640;
    }
    pnga_access_ptr(IVar4,local_618,local_5b8,&stack0xfffffffffffff990,local_538);
    pIVar14 = local_660;
    lVar21 = 1;
    if (0 < (long)local_668) {
      pbVar17 = (byte *)0x0;
      do {
        lVar21 = lVar21 * ((local_5b8[(long)pbVar17] - local_618[(long)pbVar17]) + 1);
        pbVar17 = pbVar17 + 1;
      } while (local_668 != pbVar17);
    }
    if (0 < (long)local_668) {
      pbVar17 = (byte *)0x0;
      do {
        local_478[(long)pbVar17] = (ahi[(long)pbVar17] - alo[(long)pbVar17]) + 1;
        pbVar17 = pbVar17 + 1;
      } while (local_668 != pbVar17);
    }
    if (0 < (long)local_658) {
      pbVar17 = (byte *)0x0;
      do {
        local_4b8[(long)pbVar17] = (bhi[(long)pbVar17] - local_660[(long)pbVar17]) + 1;
        pbVar17 = pbVar17 + 1;
      } while (local_658 != pbVar17);
    }
    if ((long)local_668 < 1) {
      pIVar15 = (Integer *)0x0;
    }
    else {
      lVar11 = 1;
      pbVar17 = (byte *)0x0;
      pIVar15 = (Integer *)0x0;
      do {
        pIVar15 = (Integer *)((long)pIVar15 + local_618[(long)pbVar17] * lVar11);
        lVar11 = lVar11 * local_538[(long)pbVar17];
        pbVar17 = pbVar17 + 1;
      } while (local_668 != pbVar17);
    }
    if (((*local_628 | 0x20) != 0x6e) || (local_668 != local_658)) {
LAB_00114ad5:
      local_5c8 = pIVar15;
      local_650 = pnga_malloc(lVar21,(int)local_620,"v");
      pvVar10 = pnga_malloc((long)local_668 * lVar21,0x3f2,"si");
      subscript = pnga_malloc((long)local_658 * lVar21,0x3f2,"di");
      if (local_638 < local_630) {
        if (0 < (long)local_668) {
          pbVar17 = (byte *)0x0;
          do {
            local_338.lo[(long)(pbVar17 + -1)] = local_618[(long)pbVar17];
            if (pbVar17 == (byte *)0x0) {
              local_578[0] = 1;
            }
            else {
              local_578[(long)pbVar17] =
                   (((&uStack_5c0)[(long)pbVar17] - (&local_620)[(long)pbVar17]) + 1) *
                   local_578[(long)(pbVar17 + -1)];
            }
            pbVar17 = pbVar17 + 1;
          } while (local_668 != pbVar17);
        }
        if (0 < lVar21) {
          lVar11 = 0;
          lVar18 = 0;
          do {
            if (0 < (long)local_658) {
              lVar19 = 0;
              do {
                lVar20 = local_338.lo[lVar19 + -1];
                *(long *)((long)pvVar10 + lVar19 * 8 + (long)local_658 * lVar11) = lVar20;
                if ((lVar18 + 1) % local_578[lVar19] == 0) {
                  local_338.lo[lVar19 + -1] = lVar20 + 1;
                }
                if (local_5b8[lVar19] < local_338.lo[lVar19 + -1]) {
                  local_338.lo[lVar19 + -1] = local_618[lVar19];
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 < (long)local_658);
            }
            lVar18 = lVar18 + 1;
            lVar11 = lVar11 + 8;
          } while (lVar18 != lVar21);
        }
        local_4f8 = 1;
        if (1 < (long)local_658) {
          lVar11 = 1;
          pbVar17 = (byte *)0x0;
          do {
            lVar11 = lVar11 * local_4b8[(long)pbVar17];
            local_4f0[(long)pbVar17] = lVar11;
            pbVar17 = pbVar17 + 1;
          } while (local_658 + -1 != pbVar17);
        }
        local_3b8[(long)(local_658 + -9)] = 1;
        if (1 < (long)local_658) {
          lVar11 = local_3b8[(long)(local_658 + -9)];
          pbVar17 = local_658 + -1;
          do {
            lVar11 = lVar11 * local_4b8[(long)pbVar17];
            local_3b8[(long)(pbVar17 + -9)] = lVar11;
            pbVar17 = pbVar17 + -1;
          } while (0 < (long)pbVar17);
        }
        local_438[0] = 1;
        if (1 < (long)local_658) {
          lVar11 = 1;
          pbVar17 = (byte *)0x0;
          do {
            lVar11 = lVar11 * local_538[(long)pbVar17];
            local_438[(long)(pbVar17 + 1)] = lVar11;
            pbVar17 = pbVar17 + 1;
          } while (local_658 + -1 != pbVar17);
        }
        if (0 < lVar21) {
          lVar11 = 0;
          lVar18 = 0;
          do {
            if ((*local_628 | 0x20) == 0x6e) {
              if ((long)local_668 < 1) {
LAB_00114d6e:
                lVar19 = 0;
              }
              else {
                pbVar17 = (byte *)0x0;
                lVar19 = 0;
                do {
                  lVar19 = lVar19 + (*(long *)((long)pvVar10 +
                                              (long)pbVar17 * 8 + (long)local_658 * lVar11) -
                                    local_660[(long)pbVar17]) * local_4f0[(long)(pbVar17 + -1)];
                  pbVar17 = pbVar17 + 1;
                } while (local_668 != pbVar17);
              }
            }
            else {
              if ((long)local_668 < 1) goto LAB_00114d6e;
              pbVar17 = local_668 + 1;
              lVar19 = 0;
              do {
                lVar19 = lVar19 + (*(long *)((long)pvVar10 +
                                            (long)pbVar17 * 8 + (long)local_658 * lVar11 + -0x10) -
                                  local_660[(long)(pbVar17 + -2)]) * alStack_408[(long)pbVar17];
                pbVar17 = pbVar17 + -1;
              } while (1 < (long)pbVar17);
            }
            if (0 < (long)local_668) {
              lVar20 = 0;
              do {
                lVar13 = local_478[lVar20];
                *(long *)((long)subscript + lVar20 * 8 + (long)local_658 * lVar11) =
                     lVar19 % lVar13 + alo[lVar20];
                lVar20 = lVar20 + 1;
                lVar19 = lVar19 / lVar13;
              } while (lVar20 < (long)local_668);
            }
            if ((long)local_658 < 1) {
              lVar19 = 0;
            }
            else {
              pbVar17 = (byte *)0x0;
              lVar19 = 0;
              do {
                lVar19 = lVar19 + local_438[(long)pbVar17] *
                                  *(long *)((long)pvVar10 +
                                           (long)pbVar17 * 8 + (long)local_658 * lVar11);
                pbVar17 = pbVar17 + 1;
              } while (local_658 != pbVar17);
            }
            if (CONCAT44(local_620._4_4_,(int)local_620) - 0x3e9U < 0x10) {
              lVar19 = lVar19 - (long)local_5c8;
              switch(CONCAT44(local_620._4_4_,(int)local_620)) {
              case 0x3e9:
                *(undefined4 *)((long)local_650 + lVar18 * 4) =
                     *(undefined4 *)((long)in_stack_fffffffffffff990 + lVar19 * 4);
                break;
              case 0x3ea:
              case 0x3ee:
              case 0x3f8:
                *(Integer *)((long)local_650 + lVar18 * 8) = in_stack_fffffffffffff990[lVar19];
                break;
              case 0x3eb:
                *(undefined4 *)((long)local_650 + lVar18 * 4) =
                     *(undefined4 *)((long)in_stack_fffffffffffff990 + lVar19 * 4);
                break;
              case 0x3ec:
                *(Integer *)((long)local_650 + lVar18 * 8) = in_stack_fffffffffffff990[lVar19];
                break;
              case 0x3ef:
                IVar4 = (in_stack_fffffffffffff990 + lVar19 * 2)[1];
                pIVar14 = (Integer *)((long)local_650 + lVar18 * 0x10);
                *pIVar14 = in_stack_fffffffffffff990[lVar19 * 2];
                pIVar14[1] = IVar4;
              }
            }
            lVar18 = lVar18 + 1;
            lVar11 = lVar11 + 8;
          } while (lVar18 != lVar21);
        }
        pnga_release(local_640,local_618,local_5b8);
        ptr = local_650;
        pnga_gather(local_648,local_650,subscript,0,lVar21);
      }
      else {
        if (0 < (long)local_668) {
          pbVar17 = (byte *)0x0;
          do {
            local_338.lo[(long)(pbVar17 + -1)] = local_618[(long)pbVar17];
            if (pbVar17 == (byte *)0x0) {
              local_578[0] = 1;
            }
            else {
              local_578[(long)pbVar17] =
                   (((&uStack_5c0)[(long)pbVar17] - (&local_620)[(long)pbVar17]) + 1) *
                   local_578[(long)(pbVar17 + -1)];
            }
            pbVar17 = pbVar17 + 1;
          } while (local_668 != pbVar17);
        }
        if (0 < lVar21) {
          lVar11 = 0;
          lVar18 = 0;
          do {
            if (0 < (long)local_668) {
              lVar19 = 0;
              do {
                lVar20 = local_338.lo[lVar19 + -1];
                *(long *)((long)pvVar10 + lVar19 * 8 + (long)local_668 * lVar11) = lVar20;
                if ((lVar18 + 1) % local_578[lVar19] == 0) {
                  local_338.lo[lVar19 + -1] = lVar20 + 1;
                }
                if (local_5b8[lVar19] < local_338.lo[lVar19 + -1]) {
                  local_338.lo[lVar19 + -1] = local_618[lVar19];
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 < (long)local_668);
            }
            lVar18 = lVar18 + 1;
            lVar11 = lVar11 + 8;
          } while (lVar18 != lVar21);
        }
        local_4f8 = 1;
        if (1 < (long)local_668) {
          lVar11 = 1;
          pbVar17 = (byte *)0x0;
          do {
            lVar11 = lVar11 * local_478[(long)pbVar17];
            local_4f0[(long)pbVar17] = lVar11;
            pbVar17 = pbVar17 + 1;
          } while (local_668 + -1 != pbVar17);
        }
        local_3b8[(long)(local_668 + -9)] = 1;
        if (1 < (long)local_668) {
          lVar11 = local_3b8[(long)(local_668 + -9)];
          pbVar17 = local_668 + -1;
          do {
            lVar11 = lVar11 * local_478[(long)pbVar17];
            local_3b8[(long)(pbVar17 + -9)] = lVar11;
            pbVar17 = pbVar17 + -1;
          } while (0 < (long)pbVar17);
        }
        local_438[0] = 1;
        if (1 < (long)local_668) {
          lVar11 = 1;
          pbVar17 = (byte *)0x0;
          do {
            lVar11 = lVar11 * local_538[(long)pbVar17];
            local_438[(long)(pbVar17 + 1)] = lVar11;
            pbVar17 = pbVar17 + 1;
          } while (local_668 + -1 != pbVar17);
        }
        if (0 < lVar21) {
          local_5e0 = (void *)((long)pvVar10 + -8);
          lVar11 = 8;
          lVar18 = 0;
          lVar19 = 0;
          do {
            if ((*local_628 | 0x20) == 0x6e) {
              if ((long)local_668 < 1) {
LAB_001150e5:
                lVar20 = 0;
              }
              else {
                pbVar17 = (byte *)0x0;
                lVar20 = 0;
                do {
                  lVar20 = lVar20 + (*(long *)((long)pvVar10 +
                                              (long)pbVar17 * 8 + (long)local_668 * lVar18) -
                                    alo[(long)pbVar17]) * local_4f0[(long)(pbVar17 + -1)];
                  pbVar17 = pbVar17 + 1;
                } while (local_668 != pbVar17);
              }
            }
            else {
              if ((long)local_668 < 1) goto LAB_001150e5;
              pbVar17 = local_668 + 1;
              plVar12 = (long *)((long)local_668 * lVar11 + (long)pvVar10 + -8);
              lVar20 = 0;
              do {
                lVar20 = lVar20 + (*plVar12 - alo[(long)(pbVar17 + -2)]) *
                                  alStack_408[(long)pbVar17];
                pbVar17 = pbVar17 + -1;
                plVar12 = plVar12 + -1;
              } while (1 < (long)pbVar17);
            }
            if (0 < (long)local_658) {
              lVar13 = 0;
              do {
                lVar2 = local_4b8[lVar13];
                *(long *)((long)subscript + lVar13 * 8 + (long)local_658 * lVar18) =
                     lVar20 % lVar2 + local_660[lVar13];
                lVar13 = lVar13 + 1;
                lVar20 = lVar20 / lVar2;
              } while (lVar13 < (long)local_658);
            }
            if ((long)local_668 < 1) {
              lVar20 = 0;
            }
            else {
              pbVar17 = (byte *)0x0;
              lVar20 = 0;
              do {
                lVar20 = lVar20 + local_438[(long)pbVar17] *
                                  *(long *)((long)pvVar10 +
                                           (long)pbVar17 * 8 + (long)local_668 * lVar18);
                pbVar17 = pbVar17 + 1;
              } while (local_668 != pbVar17);
            }
            if (CONCAT44(local_620._4_4_,(int)local_620) - 0x3e9U < 0x10) {
              lVar20 = lVar20 - (long)local_5c8;
              switch(CONCAT44(local_620._4_4_,(int)local_620)) {
              case 0x3e9:
                *(undefined4 *)((long)local_650 + lVar19 * 4) =
                     *(undefined4 *)((long)in_stack_fffffffffffff990 + lVar20 * 4);
                break;
              case 0x3ea:
              case 0x3ee:
              case 0x3f8:
                *(Integer *)((long)local_650 + lVar19 * 8) = in_stack_fffffffffffff990[lVar20];
                break;
              case 0x3eb:
                *(undefined4 *)((long)local_650 + lVar19 * 4) =
                     *(undefined4 *)((long)in_stack_fffffffffffff990 + lVar20 * 4);
                break;
              case 0x3ec:
                *(Integer *)((long)local_650 + lVar19 * 8) = in_stack_fffffffffffff990[lVar20];
                break;
              case 0x3ef:
                IVar4 = (in_stack_fffffffffffff990 + lVar20 * 2)[1];
                pIVar14 = (Integer *)((long)local_650 + lVar19 * 0x10);
                *pIVar14 = in_stack_fffffffffffff990[lVar20 * 2];
                pIVar14[1] = IVar4;
              }
            }
            lVar19 = lVar19 + 1;
            lVar18 = lVar18 + 8;
            lVar11 = lVar11 + 8;
          } while (lVar19 != lVar21);
        }
        pnga_release(local_648,local_618,local_5b8);
        ptr = local_650;
        pnga_scatter(local_640,local_650,subscript,0,lVar21);
      }
      pnga_free(subscript);
      pnga_free(pvVar10);
      pnga_free(ptr);
      goto LAB_001154e8;
    }
    if (0 < (long)local_668) {
      pbVar17 = (byte *)0x0;
      do {
        if (ahi[(long)pbVar17] - alo[(long)pbVar17] != bhi[(long)pbVar17] - local_660[(long)pbVar17]
           ) goto LAB_00114ad5;
        pbVar17 = pbVar17 + 1;
      } while (local_668 != pbVar17);
    }
    if (local_638 < local_630) {
      snga_dest_indices((Integer)local_658,local_618,local_660,local_4b8,(Integer)local_578,alo,
                        local_478,in_stack_fffffffffffff990);
      snga_dest_indices((Integer)local_658,local_5b8,pIVar14,local_4b8,(Integer)&local_4f8,alo,
                        local_478,in_stack_fffffffffffff990);
      pnga_get(local_648,local_578,&local_4f8,in_stack_fffffffffffff990,local_538);
      IVar4 = local_640;
    }
    else {
      snga_dest_indices((Integer)local_668,local_618,alo,local_478,(Integer)local_578,local_660,
                        local_4b8,in_stack_fffffffffffff990);
      snga_dest_indices((Integer)local_668,local_5b8,alo,local_478,(Integer)&local_4f8,pIVar14,
                        local_4b8,in_stack_fffffffffffff990);
      pnga_put(local_640,local_578,&local_4f8,in_stack_fffffffffffff990,local_538);
      IVar4 = local_648;
    }
  }
  else {
    if (0 < (long)local_668) {
      pbVar17 = (byte *)0x0;
      do {
        local_478[(long)pbVar17] = (ahi[(long)pbVar17] - alo[(long)pbVar17]) + 1;
        pbVar17 = pbVar17 + 1;
      } while (local_668 != pbVar17);
    }
    if ((long)local_658 < 1) {
      pbVar17 = (byte *)0x0;
    }
    else {
      pbVar9 = (byte *)0x0;
      do {
        local_4b8[(long)pbVar9] = (bhi[(long)pbVar9] - local_660[(long)pbVar9]) + 1;
        pbVar9 = pbVar9 + 1;
        pbVar17 = local_658;
      } while (local_658 != pbVar9);
    }
    if (local_638 < local_630) {
      if (-1 < (long)uVar8) {
        pnga_local_iterator_init(local_640,&local_338);
        iVar3 = pnga_local_iterator_next
                          (&local_338,local_618,local_5b8,(char **)&stack0xfffffffffffff990,
                           local_538);
        if (iVar3 != 0) {
          local_628 = pbVar17;
          do {
            pbVar17 = local_668;
            if (0 < (long)local_668) {
              sVar1 = (long)local_668 * 8;
              memcpy(local_578,local_618,sVar1);
              memcpy(&local_4f8,local_5b8,sVar1);
            }
            lVar6 = pnga_patch_intersect(local_660,bhi,local_618,local_5b8,(Integer)pbVar17);
            pbVar9 = local_658;
            pIVar14 = local_660;
            if (lVar6 != 0) {
              if ((long)pbVar17 < 2) {
                lVar21 = 1;
                lVar11 = 0;
              }
              else {
                lVar21 = 1;
                lVar11 = 0;
                pbVar16 = (byte *)0x0;
                do {
                  lVar11 = lVar11 + (local_618[(long)pbVar16] - local_578[(long)pbVar16]) * lVar21;
                  lVar21 = lVar21 * local_538[(long)pbVar16];
                  pbVar16 = pbVar16 + 1;
                } while (pbVar17 + -1 != pbVar16);
              }
              if (CONCAT44(local_620._4_4_,(int)local_620) - 0x3e9U < 0x10) {
                lVar11 = ((&local_620)[(long)pbVar17] - local_578[(long)(pbVar17 + -1)]) * lVar21 +
                         lVar11;
                switch(CONCAT44(local_620._4_4_,(int)local_620)) {
                case 0x3e9:
                case 0x3eb:
                  lVar11 = lVar11 * 4;
                  break;
                case 0x3ea:
                case 0x3ec:
                case 0x3ee:
                case 0x3f8:
                  lVar11 = lVar11 * 8;
                  break;
                default:
                  goto switchD_001146f0_caseD_3ed;
                case 0x3ef:
                  lVar11 = lVar11 * 0x10;
                }
                in_stack_fffffffffffff990 = (Integer *)((long)in_stack_fffffffffffff990 + lVar11);
              }
switchD_001146f0_caseD_3ed:
              snga_dest_indices((Integer)local_658,local_618,local_660,local_4b8,(Integer)local_578,
                                alo,local_478,in_stack_fffffffffffff990);
              snga_dest_indices((Integer)pbVar9,local_5b8,pIVar14,local_4b8,(Integer)&local_4f8,alo,
                                local_478,in_stack_fffffffffffff990);
              pnga_get(local_648,local_578,&local_4f8,in_stack_fffffffffffff990,local_538);
              pnga_release_block(local_640,(Integer)local_628);
            }
            iVar3 = pnga_local_iterator_next
                              (&local_338,local_618,local_5b8,(char **)&stack0xfffffffffffff990,
                               local_538);
          } while (iVar3 != 0);
        }
        goto LAB_001154e8;
      }
      pnga_distribution(local_640,(Integer)local_5e0,local_618,local_5b8);
      lVar6 = pnga_patch_intersect(local_660,bhi,local_618,local_5b8,(Integer)local_658);
      IVar4 = local_640;
      if (lVar6 == 0) goto LAB_001154e8;
      pnga_access_ptr(local_640,local_618,local_5b8,&stack0xfffffffffffff990,local_538);
      pIVar14 = local_660;
      snga_dest_indices((Integer)local_658,local_618,local_660,local_4b8,(Integer)local_578,alo,
                        local_478,in_stack_fffffffffffff990);
      snga_dest_indices((Integer)local_658,local_5b8,pIVar14,local_4b8,(Integer)&local_4f8,alo,
                        local_478,in_stack_fffffffffffff990);
      pnga_get(local_648,local_578,&local_4f8,in_stack_fffffffffffff990,local_538);
    }
    else {
      if (-1 < (long)uVar7) {
        local_628 = pbVar17;
        pnga_local_iterator_init(local_648,&local_338);
        iVar3 = pnga_local_iterator_next
                          (&local_338,local_618,local_5b8,(char **)&stack0xfffffffffffff990,
                           local_538);
        pIVar14 = local_660;
        if (iVar3 != 0) {
          local_5c8 = ahi;
          do {
            pbVar17 = local_668;
            if (0 < (long)local_668) {
              sVar1 = (long)local_668 * 8;
              memcpy(local_578,local_618,sVar1);
              memcpy(&local_4f8,local_5b8,sVar1);
            }
            lVar6 = pnga_patch_intersect(alo,ahi,local_618,local_5b8,(Integer)pbVar17);
            if (lVar6 != 0) {
              if ((long)pbVar17 < 2) {
                lVar21 = 1;
                lVar11 = 0;
              }
              else {
                lVar21 = 1;
                lVar11 = 0;
                pbVar9 = (byte *)0x0;
                do {
                  lVar11 = lVar11 + (local_618[(long)pbVar9] - local_578[(long)pbVar9]) * lVar21;
                  lVar21 = lVar21 * local_538[(long)pbVar9];
                  pbVar9 = pbVar9 + 1;
                } while (pbVar17 + -1 != pbVar9);
              }
              if (CONCAT44(local_620._4_4_,(int)local_620) - 0x3e9U < 0x10) {
                lVar11 = ((&local_620)[(long)pbVar17] - local_578[(long)(pbVar17 + -1)]) * lVar21 +
                         lVar11;
                switch(CONCAT44(local_620._4_4_,(int)local_620)) {
                case 0x3e9:
                case 0x3eb:
                  lVar11 = lVar11 * 4;
                  break;
                case 0x3ea:
                case 0x3ec:
                case 0x3ee:
                case 0x3f8:
                  lVar11 = lVar11 * 8;
                  break;
                default:
                  goto switchD_0011490e_caseD_3ed;
                case 0x3ef:
                  lVar11 = lVar11 * 0x10;
                }
                in_stack_fffffffffffff990 = (Integer *)((long)in_stack_fffffffffffff990 + lVar11);
              }
switchD_0011490e_caseD_3ed:
              snga_dest_indices((Integer)pbVar17,local_618,alo,local_478,(Integer)local_578,pIVar14,
                                local_4b8,in_stack_fffffffffffff990);
              snga_dest_indices((Integer)pbVar17,local_5b8,alo,local_478,(Integer)&local_4f8,pIVar14
                                ,local_4b8,in_stack_fffffffffffff990);
              pnga_put(local_640,local_578,&local_4f8,in_stack_fffffffffffff990,local_538);
              pnga_release_block(local_648,(Integer)local_628);
              ahi = local_5c8;
            }
            iVar3 = pnga_local_iterator_next
                              (&local_338,local_618,local_5b8,(char **)&stack0xfffffffffffff990,
                               local_538);
          } while (iVar3 != 0);
        }
        goto LAB_001154e8;
      }
      pnga_distribution(local_648,(Integer)local_650,local_618,local_5b8);
      lVar6 = pnga_patch_intersect(alo,ahi,local_618,local_5b8,(Integer)local_668);
      IVar4 = local_648;
      if (lVar6 == 0) goto LAB_001154e8;
      pnga_access_ptr(local_648,local_618,local_5b8,&stack0xfffffffffffff990,local_538);
      pIVar14 = local_660;
      snga_dest_indices((Integer)local_668,local_618,alo,local_478,(Integer)local_578,local_660,
                        local_4b8,in_stack_fffffffffffff990);
      snga_dest_indices((Integer)local_668,local_5b8,alo,local_478,(Integer)&local_4f8,pIVar14,
                        local_4b8,in_stack_fffffffffffff990);
      pnga_put(local_640,local_578,&local_4f8,in_stack_fffffffffffff990,local_538);
    }
  }
  pnga_release(IVar4,local_618,local_5b8);
LAB_001154e8:
  if (uStack_5c0._4_4_ != 0) {
    IVar4 = local_5d0;
    if (((local_638 < local_630) &&
        (IVar5 = pnga_pgroup_get_world(), IVar4 = local_5d8, local_5d0 == IVar5)) &&
       (IVar5 = pnga_pgroup_get_world(), IVar4 = local_5d8, local_5d8 == IVar5)) {
      pnga_sync();
    }
    else {
      pnga_pgroup_sync(IVar4);
    }
  }
  return;
}

Assistant:

void pnga_copy_patch(char *trans,
                    Integer g_a, Integer *alo, Integer *ahi,
                    Integer g_b, Integer *blo, Integer *bhi)
{
  Integer i, j;
  Integer idx, factor;
  Integer atype, btype, andim, adims[MAXDIM], bndim, bdims[MAXDIM];
  Integer nelem;
  Integer atotal, btotal;
  Integer los[MAXDIM], his[MAXDIM];
  Integer lod[MAXDIM], hid[MAXDIM];
  Integer ld[MAXDIM], ald[MAXDIM], bld[MAXDIM];
  char *src_data_ptr, *tmp_ptr;
  Integer *src_idx_ptr, *dst_idx_ptr;
  Integer bvalue[MAXDIM], bunit[MAXDIM];
  Integer factor_idx1[MAXDIM], factor_idx2[MAXDIM], factor_data[MAXDIM];
  Integer base;
  Integer me_a, me_b;
  Integer a_grp, b_grp, anproc, bnproc;
  Integer num_blocks_a, num_blocks_b/*, chk*/;
  int use_put, has_intersection;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  a_grp = pnga_get_pgroup(g_a);
  b_grp = pnga_get_pgroup(g_b);
  me_a = pnga_pgroup_nodeid(a_grp);
  me_b = pnga_pgroup_nodeid(b_grp);
  anproc = pnga_get_pgroup_size(a_grp);
  bnproc = pnga_get_pgroup_size(b_grp);
  if (anproc <= bnproc) {
    use_put = 1;
  }  else {
    use_put = 0;
  }

  /*if (a_grp != b_grp)
    pnga_error("All matrices must be on same group for pnga_copy_patch", 0L); */
  if(local_sync_begin) {
    if (anproc <= bnproc) {
      pnga_pgroup_sync(a_grp);
    } else if (a_grp == pnga_pgroup_get_world() &&
        b_grp == pnga_pgroup_get_world()) {
      pnga_sync();
    } else {
      pnga_pgroup_sync(b_grp);
    }
  }


  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);

  if(g_a == g_b) {
    /* they are the same patch */
    if(pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) {
        return;
    /* they are in the same GA, but not the same patch */
    } else if (pnga_patch_intersect(alo, ahi, blo, bhi, andim)) {
      pnga_error("array patches cannot overlap ", 0L);
    }
  }

  if(atype != btype ) pnga_error("array type mismatch ", 0L);

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", 0L);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", 0L);

  /* check if numbers of elements in two patches match each other */
  atotal = 1; btotal = 1;
  for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);
  if(atotal != btotal)
    pnga_error("capacities two of patches do not match ", 0L);

  /* additional restrictions that apply if one or both arrays use
     block-cyclic data distributions */
  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  if (num_blocks_a >= 0 || num_blocks_b >= 0) {
    if (!(*trans == 'n' || *trans == 'N')) {
      pnga_error("Transpose option not supported for block-cyclic data", 0L);
    }
    if (!snga_test_shape(alo, ahi, blo, bhi, andim, bndim)) {
      pnga_error("Change in shape not supported for block-cyclic data", 0L);
    }
  }

  if (num_blocks_a < 0 && num_blocks_b <0) {
    /* now find out cordinates of a patch of g_a that I own */
    if (use_put) {
      pnga_distribution(g_a, me_a, los, his);
    } else {
      pnga_distribution(g_b, me_b, los, his);
    }

    /* copy my share of data */
    if (use_put) {
      has_intersection = pnga_patch_intersect(alo, ahi, los, his, andim);
    } else {
      has_intersection = pnga_patch_intersect(blo, bhi, los, his, bndim);
    }
    if(has_intersection){
      if (use_put) {
        pnga_access_ptr(g_a, los, his, &src_data_ptr, ld); 
      } else {
        pnga_access_ptr(g_b, los, his, &src_data_ptr, ld); 
      }

      /* calculate the number of elements in the patch that I own */
      nelem = 1; for(i=0; i<andim; i++) nelem *= (his[i] - los[i] + 1);

      for(i=0; i<andim; i++) ald[i] = ahi[i] - alo[i] + 1;
      for(i=0; i<bndim; i++) bld[i] = bhi[i] - blo[i] + 1;

      base = 0; factor = 1;
      for(i=0; i<andim; i++) {
        base += los[i] * factor;
        factor *= ld[i];
      }

      /*** straight copy possible if there's no reshaping or transpose ***/
      if((*trans == 'n' || *trans == 'N') &&
          snga_test_shape(alo, ahi, blo, bhi, andim, bndim)) { 
        /* find source[lo:hi] --> destination[lo:hi] */
        if (use_put) {
          snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
          snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
          pnga_put(g_b, lod, hid, src_data_ptr, ld);
          pnga_release(g_a, los, his);
        } else {
          snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
          snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
          pnga_get(g_a, lod, hid, src_data_ptr, ld);
          pnga_release(g_b, los, his);
        }
        /*** due to generality of this transformation scatter is required ***/
      } else{
        if (use_put) {
          tmp_ptr = pnga_malloc(nelem, atype, "v");
          src_idx_ptr = (Integer*) pnga_malloc((andim*nelem), MT_F_INT, "si");
          dst_idx_ptr = (Integer*) pnga_malloc((bndim*nelem), MT_F_INT, "di");

          /* calculate the destination indices */

          /* given los and his, find indices for each elements
           * bvalue: starting index in each dimension
           * bunit: stride in each dimension
           */
          for (i=0; i<andim; i++) {
            bvalue[i] = los[i];
            if (i == 0) bunit[i] = 1;
            else bunit[i] = bunit[i-1] * (his[i-1] - los[i-1] + 1);
          }

          /* source indices */
          for (i=0; i<nelem; i++) {
            for (j=0; j<andim; j++){
              src_idx_ptr[i*andim+j] = bvalue[j];
              /* if the next element is the first element in
               * one dimension, increment the index by 1
               */
              if (((i+1) % bunit[j]) == 0) bvalue[j]++;
              /* if the index becomes larger than the upper
               * bound in one dimension, reset it.
               */
              if(bvalue[j] > his[j]) bvalue[j] = los[j];
            }
          }

          /* index factor: reshaping without transpose */
          factor_idx1[0] = 1;
          for (j=1; j<andim; j++) 
            factor_idx1[j] = factor_idx1[j-1] * ald[j-1];

          /* index factor: reshaping with transpose */
          factor_idx2[andim-1] = 1;
          for (j=(andim-1)-1; j>=0; j--)
            factor_idx2[j] = factor_idx2[j+1] * ald[j+1];

          /* data factor */
          factor_data[0] = 1;
          for (j=1; j<andim; j++) 
            factor_data[j] = factor_data[j-1] * ld[j-1];

          /* destination indices */
          for(i=0; i<nelem; i++) {
            /* linearize the n-dimensional indices to one dimension */
            idx = 0;
            if (*trans == 'n' || *trans == 'N')
              for (j=0; j<andim; j++) 
                idx += (src_idx_ptr[i*andim+j] - alo[j]) *
                  factor_idx1[j];
            else
              /* if the patch needs to be transposed, reverse
               * the indices: (i, j, ...) -> (..., j, i)
               */
              for (j=(andim-1); j>=0; j--) 
                idx += (src_idx_ptr[i*andim+j] - alo[j]) *
                  factor_idx2[j];

            /* convert the one dimensional index to n-dimensional
             * indices of destination
             */
            for (j=0; j<bndim; j++) {
              dst_idx_ptr[i*bndim+j] = idx % bld[j] + blo[j]; 
              idx /= bld[j];
            }

            /* move the data block to create a new block */
            /* linearize the data indices */
            idx = 0;
            for (j=0; j<andim; j++) 
              idx += (src_idx_ptr[i*andim+j]) * factor_data[j];

            /* adjust the position
             * base: starting address of the first element */
            idx -= base;

            /* move the element to the temporary location */
            switch(atype) {
              case C_DBL: ((double*)tmp_ptr)[i] =
                          ((double*)src_data_ptr)[idx]; 
                          break;
              case C_INT:
                          ((int *)tmp_ptr)[i] = ((int *)src_data_ptr)[idx];
                          break;
              case C_DCPL:((DoubleComplex *)tmp_ptr)[i] =
                          ((DoubleComplex *)src_data_ptr)[idx];
                          break;
              case C_SCPL:((SingleComplex *)tmp_ptr)[i] =
                          ((SingleComplex *)src_data_ptr)[idx];
                          break;
              case C_FLOAT: ((float *)tmp_ptr)[i] =
                            ((float *)src_data_ptr)[idx]; 
                          break;     
              case C_LONG: ((long *)tmp_ptr)[i] =
                           ((long *)src_data_ptr)[idx];
                          break;
              case C_LONGLONG: ((long long *)tmp_ptr)[i] =
                           ((long long *)src_data_ptr)[idx];     
            }
          }
          pnga_release(g_a, los, his);
          pnga_scatter(g_b, tmp_ptr, dst_idx_ptr, 0, nelem);
          pnga_free(dst_idx_ptr);
          pnga_free(src_idx_ptr);
          pnga_free(tmp_ptr);
        } else {
          tmp_ptr = pnga_malloc(nelem, atype, "v");
          src_idx_ptr = (Integer*) pnga_malloc((andim*nelem), MT_F_INT, "si");
          dst_idx_ptr = (Integer*) pnga_malloc((bndim*nelem), MT_F_INT, "di");

          /* calculate the destination indices */

          /* given los and his, find indices for each elements
           * bvalue: starting index in each dimension
           * bunit: stride in each dimension
           */
          for (i=0; i<andim; i++) {
            bvalue[i] = los[i];
            if (i == 0) bunit[i] = 1;
            else bunit[i] = bunit[i-1] * (his[i-1] - los[i-1] + 1);
          }

          /* destination indices */
          for (i=0; i<nelem; i++) {
            for (j=0; j<bndim; j++){
              src_idx_ptr[i*bndim+j] = bvalue[j];
              /* if the next element is the first element in
               * one dimension, increment the index by 1
               */
              if (((i+1) % bunit[j]) == 0) bvalue[j]++;
              /* if the index becomes larger than the upper
               * bound in one dimension, reset it.
               */
              if(bvalue[j] > his[j]) bvalue[j] = los[j];
            }
          }

          /* index factor: reshaping without transpose */
          factor_idx1[0] = 1;
          for (j=1; j<bndim; j++) 
            factor_idx1[j] = factor_idx1[j-1] * bld[j-1];

          /* index factor: reshaping with transpose */
          factor_idx2[bndim-1] = 1;
          for (j=(bndim-1)-1; j>=0; j--)
            factor_idx2[j] = factor_idx2[j+1] * bld[j+1];

          /* data factor */
          factor_data[0] = 1;
          for (j=1; j<bndim; j++) 
            factor_data[j] = factor_data[j-1] * ld[j-1];

          /* destination indices */
          for(i=0; i<nelem; i++) {
            /* linearize the n-dimensional indices to one dimension */
            idx = 0;
            if (*trans == 'n' || *trans == 'N')
              for (j=0; j<andim; j++) 
                idx += (src_idx_ptr[i*bndim+j] - blo[j]) *
                  factor_idx1[j];
            else
              /* if the patch needs to be transposed, reverse
               * the indices: (i, j, ...) -> (..., j, i)
               */
              for (j=(andim-1); j>=0; j--) 
                idx += (src_idx_ptr[i*bndim+j] - blo[j]) *
                  factor_idx2[j];

            /* convert the one dimensional index to n-dimensional
             * indices of destination
             */
            for (j=0; j<andim; j++) {
              dst_idx_ptr[i*bndim+j] = idx % ald[j] + alo[j]; 
              idx /= ald[j];
            }

            /* move the data block to create a new block */
            /* linearize the data indices */
            idx = 0;
            for (j=0; j<bndim; j++) 
              idx += (src_idx_ptr[i*bndim+j]) * factor_data[j];

            /* adjust the position
             * base: starting address of the first element */
            idx -= base;

            /* move the element to the temporary location */
            switch(atype) {
              case C_DBL: ((double*)tmp_ptr)[i] =
                          ((double*)src_data_ptr)[idx]; 
                          break;
              case C_INT:
                          ((int *)tmp_ptr)[i] = ((int *)src_data_ptr)[idx];
                          break;
              case C_DCPL:((DoubleComplex *)tmp_ptr)[i] =
                          ((DoubleComplex *)src_data_ptr)[idx];
                          break;
              case C_SCPL:((SingleComplex *)tmp_ptr)[i] =
                          ((SingleComplex *)src_data_ptr)[idx];
                          break;
              case C_FLOAT: ((float *)tmp_ptr)[i] =
                            ((float *)src_data_ptr)[idx]; 
                          break;
              case C_LONG: ((long *)tmp_ptr)[i] =
                           ((long *)src_data_ptr)[idx];     
                          break;
              case C_LONGLONG: ((long long *)tmp_ptr)[i] =
                           ((long long *)src_data_ptr)[idx];     
            }
          }
          pnga_release(g_b, los, his);
          pnga_gather(g_a, tmp_ptr, dst_idx_ptr, 0, nelem);
          pnga_free(dst_idx_ptr);
          pnga_free(src_idx_ptr);
          pnga_free(tmp_ptr);
        }
      }
    }
  } else {
    Integer offset, last, jtot;
    for (i=0; i<andim; i++) {
      ald[i] = ahi[i] - alo[i] + 1;
    }
    for (i=0; i<bndim; i++) {
      bld[i] = bhi[i] - blo[i] + 1;
    }
    if (use_put) {
      /* Array a is block-cyclic distributed */
      if (num_blocks_a >= 0) {
#if 1
        _iterator_hdl hdl_a;
        pnga_local_iterator_init(g_a, &hdl_a);
        while (pnga_local_iterator_next(&hdl_a, los, his,
              &src_data_ptr, ld)) {
            /* Copy limits since patch intersect modifies los array */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_a, i);
            }
          }
#else
        /* Uses simple block-cyclic data distribution */
        if (!pnga_uses_proc_grid(g_a)) {
          for (i = me_a; i < num_blocks_a; i += anproc) {
            pnga_distribution(g_a, i, los, his); 
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              pnga_access_block_ptr(g_a, i, &src_data_ptr, ld);
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_a, i);
            }
          }
        } else {
          /* Uses scalapack block-cyclic data distribution */
          Integer proc_index[MAXDIM], index[MAXDIM];
          Integer topology[MAXDIM];
          Integer blocks[MAXDIM], block_dims[MAXDIM];
          pnga_get_proc_index(g_a, me_a, proc_index);
          pnga_get_proc_index(g_a, me_a, index);
          pnga_get_block_info(g_a, blocks, block_dims);
          pnga_get_proc_grid(g_a, topology);
          while (index[andim-1] < blocks[andim-1]) {
            /* find bounding coordinates of block */
            /*chk = 1;*/
            for (i = 0; i < andim; i++) {
              los[i] = index[i]*block_dims[i]+1;
              his[i] = (index[i] + 1)*block_dims[i];
              if (his[i] > adims[i]) his[i] = adims[i];
              /*if (his[i] < los[i]) chk = 0;*/
            }
            /* make temperary copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              pnga_access_block_grid_ptr(g_a, index, &src_data_ptr, ld);
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block_grid(g_a, index);
            }

            /* increment index to get next block on processor */
            index[0] += topology[0];
            for (i = 0; i < andim; i++) {
              if (index[i] >= blocks[i] && i<andim-1) {
                index[i] = proc_index[i];
                index[i+1] += topology[i+1];
              }
            }
          }
        }
#endif
      } else {
        /* Only array b is block-cyclic distributed */
        pnga_distribution(g_a, me_a, los, his); 
        if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
          pnga_access_ptr(g_a, los, his, &src_data_ptr, ld); 
          snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
          snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
          pnga_put(g_b, lod, hid, src_data_ptr, ld);
          pnga_release(g_a, los, his);
        }
      }
    } else {
      /* Array b is block-cyclic distributed */
      if (num_blocks_b >= 0) {
#if 1
        _iterator_hdl hdl_b;
        pnga_local_iterator_init(g_b, &hdl_b);
        while (pnga_local_iterator_next(&hdl_b, los, his,
              &src_data_ptr, ld)) {
            /* Copy limits since patch intersect modifies los array */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_b, i);
            }
          }
#else
        /* Uses simple block-cyclic data distribution */
        if (!pnga_uses_proc_grid(g_b)) {
          for (i = me_b; i < num_blocks_b; i += bnproc) {
            pnga_distribution(g_b, i, los, his); 
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              pnga_access_block_ptr(g_b, i, &src_data_ptr, ld);
              offset = 0;
              last = bndim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_b, i);
            }
          }
        } else {
          /* Uses scalapack block-cyclic data distribution */
          Integer proc_index[MAXDIM], index[MAXDIM];
          Integer topology[MAXDIM];
          Integer blocks[MAXDIM], block_dims[MAXDIM];
          pnga_get_proc_index(g_b, me_b, proc_index);
          pnga_get_proc_index(g_b, me_b, index);
          pnga_get_block_info(g_b, blocks, block_dims);
          pnga_get_proc_grid(g_b, topology);
          while (index[bndim-1] < blocks[bndim-1]) {
            /* find bounding coordinates of block */
            /*chk = 1;*/
            for (i = 0; i < bndim; i++) {
              los[i] = index[i]*block_dims[i]+1;
              his[i] = (index[i] + 1)*block_dims[i];
              if (his[i] > bdims[i]) his[i] = bdims[i];
              /*if (his[i] < los[i]) chk = 0;*/
            }
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              pnga_access_block_grid_ptr(g_b, index, &src_data_ptr, ld);
              offset = 0;
              last = bndim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block_grid(g_b, index);
            }

            /* increment index to get next block on processor */
            index[0] += topology[0];
            for (i = 0; i < bndim; i++) {
              if (index[i] >= blocks[i] && i<bndim-1) {
                index[i] = proc_index[i];
                index[i+1] += topology[i+1];
              }
            }
          }
        }
#endif
      } else {
        /* Array a is block-cyclic distributed */
        pnga_distribution(g_b, me_b, los, his); 
        if (pnga_patch_intersect(blo,bhi,los,his,bndim)) {
          pnga_access_ptr(g_b, los, his, &src_data_ptr, ld); 
          snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
          snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
          pnga_get(g_a, lod, hid, src_data_ptr, ld);
          pnga_release(g_b, los, his);
        }
      }
    }
  }
  /* ARMCI_AllFence(); */
  if(local_sync_end) {
    if (anproc <= bnproc) {
      pnga_pgroup_sync(a_grp);
    } else if (a_grp == pnga_pgroup_get_world() &&
        b_grp == pnga_pgroup_get_world()) {
      pnga_sync();
    } else {
      pnga_pgroup_sync(b_grp);
    }
  }
}